

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

lbool __thiscall Minisat::Solver::search(Solver *this,int nof_conflicts)

{
  Size *pSVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  uint64_t uVar14;
  bool bVar15;
  byte bVar16;
  CRef CVar17;
  Lit LVar18;
  Size *pSVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint8_t *puVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  CRef cr;
  int backtrack_level;
  uint local_b0;
  int local_ac;
  vec<Minisat::Lit,_int> local_a8;
  int local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  int local_80;
  int local_7c;
  vec<unsigned_int,_int> *local_78;
  ClauseAllocator *local_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_80 = nof_conflicts;
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x2c0,"lbool Minisat::Solver::search(int)");
  }
  local_a8.data = (Lit *)0x0;
  local_a8.sz = 0;
  local_a8.cap = 0;
  this->starts = this->starts + 1;
  pSVar1 = &(this->trail).sz;
  local_70 = &this->ca;
  local_78 = &this->learnts;
  local_48._8_4_ = (int)DAT_0010e770;
  local_48._0_8_ = DAT_0010e770._8_8_;
  local_48._12_4_ = DAT_0010e770._4_4_;
  local_ac = 0;
  do {
    local_68[0] = local_ac < local_80 || local_80 < 0;
    while( true ) {
      CVar17 = propagate(this);
      puVar25 = &l_False;
      if (CVar17 != 0xffffffff) break;
      if ((((local_68[0] == '\0') || (this->asynch_interrupt != false)) ||
          ((-1 < this->conflict_budget && ((ulong)this->conflict_budget <= this->conflicts)))) ||
         ((-1 < this->propagation_budget && ((ulong)this->propagation_budget <= this->propagations))
         )) {
        dVar12 = progressEstimate(this);
        this->progress_estimate = dVar12;
        cancelUntil(this,0);
        puVar25 = &l_Undef;
        goto LAB_0010a9d9;
      }
      if (((this->trail_lim).sz == 0) && (bVar15 = simplify(this), !bVar15)) goto LAB_0010a9d9;
      if (this->max_learnts <= (double)((this->learnts).sz - (this->trail).sz)) {
        reduceDB(this);
      }
      while (iVar6 = (this->trail_lim).sz, iVar6 < (this->assumptions).sz) {
        LVar18.x = (this->assumptions).data[iVar6].x;
        if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz
            <= LVar18.x >> 1) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar16 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                 map.data[LVar18.x >> 1].value;
        bVar20 = (byte)LVar18.x & 1 ^ bVar16;
        bVar16 = bVar16 & 2;
        if ((bVar20 != l_True || (l_True & 2) != 0) && (bVar16 & l_True) == 0) {
          if (bVar20 == l_False && (l_False & 2) == 0 || (bVar16 & l_False) != 0) {
            analyzeFinal(this,(Lit)(LVar18.x ^ 1),&this->conflict);
            puVar25 = &l_False;
            goto LAB_0010a9d9;
          }
          if (LVar18.x != 0xfffffffe) goto LAB_0010a6d9;
          break;
        }
        local_b0 = *pSVar1;
        vec<int,_int>::push(&this->trail_lim,(int *)&local_b0);
      }
      this->decisions = this->decisions + 1;
      LVar18 = pickBranchLit(this);
      if (LVar18.x == -2) {
        puVar25 = &l_True;
        goto LAB_0010a9d9;
      }
LAB_0010a6d9:
      local_b0 = *pSVar1;
      vec<int,_int>::push(&this->trail_lim,(int *)&local_b0);
      uncheckedEnqueue(this,LVar18,0xffffffff);
    }
    this->conflicts = this->conflicts + 1;
    if ((this->trail_lim).sz == 0) {
LAB_0010a9d9:
      uVar5 = *puVar25;
      if (local_a8.data != (Lit *)0x0) {
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
        free(local_a8.data);
      }
      return (lbool)uVar5;
    }
    if (local_a8.data != (Lit *)0x0) {
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
    }
    analyze(this,CVar17,&local_a8,&local_7c);
    cancelUntil(this,local_7c);
    if (local_a8.sz == 1) {
      LVar18.x = (local_a8.data)->x;
      CVar17 = 0xffffffff;
    }
    else {
      local_b0 = ClauseAllocator::alloc(local_70,&local_a8,true);
      vec<unsigned_int,_int>::push(local_78,&local_b0);
      attachClause(this,local_b0);
      uVar23 = (ulong)local_b0;
      uVar7 = (this->ca).ra.sz;
      if (uVar7 <= local_b0) {
LAB_0010aa4c:
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x3f,
                      "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                     );
      }
      puVar9 = (this->ca).ra.memory;
      if ((puVar9[uVar23] & 8) == 0) {
LAB_0010aa6b:
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                      ,0xd6,"float &Minisat::Clause::activity()");
      }
      uVar21 = (ulong)(puVar9[uVar23] >> 5);
      dVar12 = this->cla_inc;
      fVar26 = (float)((double)(float)puVar9[uVar23 + uVar21 + 1] + dVar12);
      puVar9[uVar23 + uVar21 + 1] = (uint)fVar26;
      if (1e+20 < fVar26) {
        lVar22 = (long)(this->learnts).sz;
        if (0 < lVar22) {
          puVar9 = local_78->data;
          puVar10 = (local_70->ra).memory;
          lVar24 = 0;
          do {
            uVar8 = puVar9[lVar24];
            if (uVar7 <= uVar8) goto LAB_0010aa4c;
            if ((puVar10[uVar8] & 8) == 0) goto LAB_0010aa6b;
            uVar23 = (ulong)(puVar10[uVar8] >> 5);
            puVar10[(ulong)uVar8 + uVar23 + 1] =
                 (uint)((float)puVar10[(ulong)uVar8 + uVar23 + 1] * 1e-20);
            lVar24 = lVar24 + 1;
          } while (lVar22 != lVar24);
        }
        this->cla_inc = dVar12 * 1e-20;
      }
      LVar18.x = (local_a8.data)->x;
      CVar17 = local_b0;
    }
    uncheckedEnqueue(this,LVar18,CVar17);
    local_ac = local_ac + 1;
    uVar3 = this->var_decay;
    uVar4 = this->clause_decay;
    auVar27._8_4_ = (int)uVar3;
    auVar27._0_8_ = uVar4;
    auVar27._12_4_ = (int)((ulong)uVar3 >> 0x20);
    auVar27 = divpd(local_48,auVar27);
    dVar12 = this->cla_inc * auVar27._0_8_;
    dVar13 = this->var_inc * auVar27._8_8_;
    auVar11._8_4_ = SUB84(dVar13,0);
    auVar11._0_8_ = dVar12;
    auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
    this->cla_inc = dVar12;
    this->var_inc = (double)auVar11._8_8_;
    piVar2 = &this->learntsize_adjust_cnt;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      auVar28._0_8_ = this->learntsize_inc * this->max_learnts;
      auVar28._8_8_ = this->learntsize_adjust_inc * this->learntsize_adjust_confl;
      this->learntsize_adjust_cnt = (int)auVar28._8_8_;
      this->max_learnts = auVar28._0_8_;
      this->learntsize_adjust_confl = auVar28._8_8_;
      if (0 < this->verbosity) {
        pSVar19 = pSVar1;
        if ((this->trail_lim).sz != 0) {
          pSVar19 = (this->trail_lim).data;
        }
        local_84 = (uint)this->conflicts;
        uVar14 = this->dec_vars;
        local_88 = (uint)this->num_clauses;
        local_8c = (uint)this->clauses_literals;
        local_90 = (int)this->num_learnts;
        local_58 = (undefined4)this->learnts_literals;
        uStack_50 = (undefined4)(this->learnts_literals >> 0x20);
        uStack_54 = 0x43300000;
        uStack_4c = 0x45300000;
        iVar6 = *pSVar19;
        local_68 = auVar28;
        dVar12 = progressEstimate(this);
        printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",
               SUB84((((double)CONCAT44(uStack_4c,uStack_50) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(uStack_54,local_58) - 4503599627370496.0)) / (double)local_90
                     ,0),dVar12 * 100.0,(ulong)local_84,(ulong)(uint)((int)uVar14 - iVar6),
               (ulong)local_88,(ulong)local_8c,(ulong)(uint)(int)(double)local_68._0_8_,local_90);
      }
    }
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause;
    starts++;

    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
            conflicts++; conflictC++;
            if (decisionLevel() == 0) return l_False;

            learnt_clause.clear();
            analyze(confl, learnt_clause, backtrack_level);
            cancelUntil(backtrack_level);

            if (learnt_clause.size() == 1){
                uncheckedEnqueue(learnt_clause[0]);
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                learnts.push(cr);
                attachClause(cr);
                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }

            varDecayActivity();
            claDecayActivity();

            if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

                if (verbosity >= 1)
                    printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", 
                           (int)conflicts, 
                           (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                           (int)max_learnts, nLearnts(), (double)learnts_literals/nLearnts(), progressEstimate()*100);
            }

        }else{
            // NO CONFLICT
            if ((nof_conflicts >= 0 && conflictC >= nof_conflicts) || !withinBudget()){
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();
                cancelUntil(0);
                return l_Undef; }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify())
                return l_False;

            if (learnts.size()-nAssigns() >= max_learnts)
                // Reduce the set of learnt clauses:
                reduceDB();

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}